

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.cpp
# Opt level: O0

void __thiscall
duckdb::CompressedStringScanState::Initialize
          (CompressedStringScanState *this,ColumnSegment *segment,bool initialize_dictionary)

{
  uint uVar1;
  shared_ptr<duckdb::Vector,_true> *this_00;
  idx_t iVar2;
  data_ptr_t pdVar3;
  CompressedStringScanState *this_01;
  CompressedStringScanState *pCVar4;
  IOException *this_02;
  StringDictionaryContainer idx;
  string_t *psVar5;
  byte in_DL;
  ColumnSegment *in_RSI;
  long in_RDI;
  string_t sVar6;
  uint16_t str_len;
  uint32_t i;
  string_t *dict_child_data;
  uint index_buffer_offset;
  dictionary_compression_header_t *header_ptr;
  string *in_stack_ffffffffffffff38;
  BlockManager *in_stack_ffffffffffffff40;
  ColumnSegment *in_stack_ffffffffffffff48;
  allocator *paVar7;
  undefined8 local_98;
  char *local_90;
  uint local_84;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  allocator local_49;
  string local_48 [36];
  uint local_24;
  long local_20;
  byte local_11;
  ColumnSegment *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  optional_ptr<duckdb::BufferHandle,_true>::operator->
            ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff40);
  this_00 = (shared_ptr<duckdb::Vector,_true> *)BufferHandle::Ptr((BufferHandle *)0x1977740);
  iVar2 = ColumnSegment::GetBlockOffset(local_10);
  *(data_ptr_t *)(in_RDI + 0x60) =
       (data_ptr_t)
       ((long)&(this_00->internal).super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr + iVar2);
  local_20 = *(long *)(in_RDI + 0x60);
  pdVar3 = data_ptr_cast<unsigned_int>((uint *)(local_20 + 8));
  local_24 = Load<unsigned_int>(pdVar3);
  pdVar3 = data_ptr_cast<unsigned_int>((uint *)(local_20 + 0xc));
  uVar1 = Load<unsigned_int>(pdVar3);
  *(uint *)(in_RDI + 0x78) = uVar1;
  pdVar3 = data_ptr_cast<unsigned_int>((uint *)(local_20 + 0x10));
  uVar1 = Load<unsigned_int>(pdVar3);
  *(char *)(in_RDI + 0x40) = (char)uVar1;
  iVar2 = ColumnSegment::GetBlockOffset(local_10);
  this_01 = (CompressedStringScanState *)(iVar2 + local_24 + (ulong)*(uint *)(in_RDI + 0x78) * 4);
  ColumnSegment::GetBlockManager((ColumnSegment *)0x1977810);
  pCVar4 = (CompressedStringScanState *)BlockManager::GetBlockSize(in_stack_ffffffffffffff40);
  if (this_01 <= pCVar4) {
    *(ulong *)(in_RDI + 0x70) = *(long *)(in_RDI + 0x60) + (ulong)local_24;
    pdVar3 = data_ptr_cast<unsigned_char>((uchar *)(*(long *)(in_RDI + 0x60) + 0x14));
    *(data_ptr_t *)(in_RDI + 0x68) = pdVar3;
    ColumnSegment::GetBlockManager((ColumnSegment *)0x1977927);
    iVar2 = BlockManager::GetBlockSize(in_stack_ffffffffffffff40);
    *(idx_t *)(in_RDI + 0xa0) = iVar2;
    optional_ptr<duckdb::BufferHandle,_true>::operator*
              ((optional_ptr<duckdb::BufferHandle,_true> *)in_stack_ffffffffffffff40);
    idx = DictionaryCompression::GetDictionary
                    (in_stack_ffffffffffffff48,(BufferHandle *)in_stack_ffffffffffffff40);
    *(StringDictionaryContainer *)(in_RDI + 0x98) = idx;
    if ((local_11 & 1) != 0) {
      make_buffer<duckdb::Vector,duckdb::LogicalType&,unsigned_int&>
                ((LogicalType *)in_stack_ffffffffffffff48,(uint *)in_stack_ffffffffffffff40);
      shared_ptr<duckdb::Vector,_true>::operator=
                (this_00,(shared_ptr<duckdb::Vector,_true> *)in_stack_ffffffffffffff48);
      shared_ptr<duckdb::Vector,_true>::~shared_ptr((shared_ptr<duckdb::Vector,_true> *)0x19779c3);
      *(ulong *)(in_RDI + 0x90) = (ulong)*(uint *)(in_RDI + 0x78);
      shared_ptr<duckdb::Vector,_true>::operator*
                ((shared_ptr<duckdb::Vector,_true> *)in_stack_ffffffffffffff40);
      psVar5 = FlatVector::GetData<duckdb::string_t>((Vector *)0x19779e6);
      shared_ptr<duckdb::Vector,_true>::operator*
                ((shared_ptr<duckdb::Vector,_true> *)in_stack_ffffffffffffff40);
      FlatVector::SetNull((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (idx_t)idx,(bool)in_stack_ffffffffffffff97);
      for (local_84 = 1; local_84 < *(uint *)(in_RDI + 0x78); local_84 = local_84 + 1) {
        GetStringLength((CompressedStringScanState *)in_stack_ffffffffffffff48,
                        (sel_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        UnsafeNumericCast<int,unsigned_int,void>
                  (*(uint *)(*(long *)(in_RDI + 0x70) + (ulong)local_84 * 4));
        sVar6 = FetchStringFromDict(this_01,(int32_t)((ulong)in_RDI >> 0x20),
                                    (uint16_t)((ulong)in_RDI >> 0x10));
        local_98 = sVar6.value._0_8_;
        *(undefined8 *)&psVar5[local_84].value = local_98;
        local_90 = sVar6.value._8_8_;
        psVar5[local_84].value.pointer.ptr = local_90;
      }
    }
    return;
  }
  this_02 = (IOException *)__cxa_allocate_exception(0x10);
  paVar7 = &local_49;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_48,
             "Failed to scan dictionary string - index was out of range. Database file appears to be corrupted."
             ,paVar7);
  IOException::IOException(this_02,in_stack_ffffffffffffff38);
  __cxa_throw(this_02,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void CompressedStringScanState::Initialize(ColumnSegment &segment, bool initialize_dictionary) {
	baseptr = handle->Ptr() + segment.GetBlockOffset();

	// Load header values
	auto header_ptr = reinterpret_cast<dictionary_compression_header_t *>(baseptr);
	auto index_buffer_offset = Load<uint32_t>(data_ptr_cast(&header_ptr->index_buffer_offset));
	index_buffer_count = Load<uint32_t>(data_ptr_cast(&header_ptr->index_buffer_count));
	current_width = (bitpacking_width_t)(Load<uint32_t>(data_ptr_cast(&header_ptr->bitpacking_width)));
	if (segment.GetBlockOffset() + index_buffer_offset + sizeof(uint32_t) * index_buffer_count >
	    segment.GetBlockManager().GetBlockSize()) {
		throw IOException(
		    "Failed to scan dictionary string - index was out of range. Database file appears to be corrupted.");
	}
	index_buffer_ptr = reinterpret_cast<uint32_t *>(baseptr + index_buffer_offset);
	base_data = data_ptr_cast(baseptr + DictionaryCompression::DICTIONARY_HEADER_SIZE);

	block_size = segment.GetBlockManager().GetBlockSize();

	dict = DictionaryCompression::GetDictionary(segment, *handle);
	if (!initialize_dictionary) {
		// Used by fetch, as fetch will never produce a DictionaryVector
		return;
	}

	dictionary = make_buffer<Vector>(segment.type, index_buffer_count);
	dictionary_size = index_buffer_count;
	auto dict_child_data = FlatVector::GetData<string_t>(*(dictionary));
	FlatVector::SetNull(*dictionary, 0, true);
	for (uint32_t i = 1; i < index_buffer_count; i++) {
		// NOTE: the passing of dict_child_vector, will not be used, its for big strings
		uint16_t str_len = GetStringLength(i);
		dict_child_data[i] = FetchStringFromDict(UnsafeNumericCast<int32_t>(index_buffer_ptr[i]), str_len);
	}
}